

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<char> * __thiscall
irr::core::string<char>::subString(string<char> *this,u32 begin,s32 length,bool make_lower)

{
  u32 uVar1;
  int in_ECX;
  uint in_EDX;
  ulong in_RSI;
  string<char> *in_RDI;
  byte in_R8B;
  string<char> *o;
  stl_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  string<char> *in_stack_ffffffffffffffc0;
  
  if ((in_ECX < 1) ||
     (uVar1 = size((string<char> *)0x343dff), in_stack_ffffffffffffffa4 = in_EDX, uVar1 <= in_EDX))
  {
    string<char>((string<char> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (char *)in_stack_ffffffffffffff98);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&stack0xffffffffffffffc0,in_RSI);
    string((string<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    if ((in_R8B & 1) != 0) {
      string<char>::make_lower(in_stack_ffffffffffffffc0);
    }
  }
  return in_RDI;
}

Assistant:

string<T> subString(u32 begin, s32 length, bool make_lower = false) const
	{
		// if start after string
		// or no proper substring length
		if ((length <= 0) || (begin >= size()))
			return string<T>("");

		string<T> o = str.substr(begin, length);
		if (make_lower)
			o.make_lower();
		return o;
	}